

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhInstallCell(lhcell *pCell)

{
  uint uVar1;
  lhpage *plVar2;
  lhcell *plVar3;
  uint uVar4;
  sxu32 sVar5;
  lhcell **pplVar6;
  lhcell **pplVar7;
  ulong uVar8;
  lhcell **pplVar9;
  
  plVar2 = pCell->pPage->pMaster;
  if (plVar2->nCell == 0) {
    pplVar6 = (lhcell **)SyMemBackendAlloc(&plVar2->pHash->sAllocator,0x100);
    if (pplVar6 == (lhcell **)0x0) {
      return -1;
    }
    uVar8 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)pplVar6 + uVar8 + 4) = 0;
      uVar8 = uVar8 + 4;
    } while (uVar8 < 0xfc);
    plVar2->apCell = pplVar6;
    plVar2->nCellSize = 0x20;
  }
  uVar1 = plVar2->nCellSize;
  uVar4 = uVar1 - 1 & pCell->nHash;
  pplVar6 = plVar2->apCell;
  pCell->pNextCol = pplVar6[uVar4];
  if (pplVar6[uVar4] != (lhcell *)0x0) {
    pplVar6[uVar4]->pPrevCol = pCell;
  }
  pplVar6[uVar4] = pCell;
  pplVar6 = &plVar2->pList;
  if (plVar2->pFirst == (lhcell *)0x0) {
    pplVar9 = &plVar2->pFirst;
  }
  else {
    plVar3 = *pplVar6;
    pplVar9 = pplVar6;
    if (plVar3 == (lhcell *)0x0) goto LAB_001143f4;
    pCell->pNext = plVar3;
    pplVar6 = &plVar3->pPrev;
  }
  *pplVar6 = pCell;
LAB_001143f4:
  *pplVar9 = pCell;
  uVar4 = plVar2->nCell + 1;
  plVar2->nCell = uVar4;
  if (uVar4 < 100000 && uVar1 * 3 <= uVar4) {
    pplVar6 = (lhcell **)SyMemBackendAlloc(&plVar2->pHash->sAllocator,uVar1 << 4);
    if (pplVar6 != (lhcell **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        pplVar7 = (lhcell **)((long)pplVar6 + (ulong)(uVar1 << 4));
        pplVar9 = pplVar6;
        do {
          *(undefined1 *)pplVar9 = 0;
          if (pplVar7 <= (lhcell **)((long)pplVar9 + 1)) break;
          *(undefined1 *)((long)pplVar9 + 1) = 0;
          if (pplVar7 <= (lhcell **)((long)pplVar9 + 2)) break;
          *(undefined1 *)((long)pplVar9 + 2) = 0;
          if (pplVar7 <= (lhcell **)((long)pplVar9 + 3)) break;
          *(undefined1 *)((long)pplVar9 + 3) = 0;
          pplVar9 = (lhcell **)((long)pplVar9 + 4);
        } while (pplVar9 < pplVar7);
      }
      sVar5 = plVar2->nCell;
      if (sVar5 != 0) {
        pplVar9 = &plVar2->pList;
        do {
          plVar3 = *pplVar9;
          plVar3->pNextCol = (lhcell *)0x0;
          plVar3->pPrevCol = (lhcell *)0x0;
          uVar4 = plVar3->nHash & uVar1 * 2 - 1;
          plVar3->pNextCol = pplVar6[uVar4];
          if (pplVar6[uVar4] != (lhcell *)0x0) {
            pplVar6[uVar4]->pPrevCol = plVar3;
          }
          pplVar6[uVar4] = plVar3;
          pplVar9 = &plVar3->pNext;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      SyMemBackendFree(&plVar2->pHash->sAllocator,plVar2->apCell);
      plVar2->apCell = pplVar6;
      plVar2->nCellSize = uVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhInstallCell(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	sxu32 iBucket;
	if( pPage->nCell < 1 ){
		sxu32 nTableSize = 32; /* Must be a power of two */
		lhcell **apTable;
		/* Allocate a new cell table */
		apTable = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nTableSize * sizeof(lhcell *));
		if( apTable == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Zero the new table */
		SyZero((void *)apTable, nTableSize * sizeof(lhcell *));
		/* Install it */
		pPage->apCell = apTable;
		pPage->nCellSize = nTableSize;
	}
	iBucket = pCell->nHash & (pPage->nCellSize - 1);
	pCell->pNextCol = pPage->apCell[iBucket];
	if( pPage->apCell[iBucket] ){
		pPage->apCell[iBucket]->pPrevCol = pCell;
	}
	pPage->apCell[iBucket] = pCell;
	if( pPage->pFirst == 0 ){
		pPage->pFirst = pPage->pList = pCell;
	}else{
		MACRO_LD_PUSH(pPage->pList,pCell);
	}
	pPage->nCell++;
	if( (pPage->nCell >= pPage->nCellSize * 3) && pPage->nCell < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pPage->nCellSize << 1;
		lhcell *pEntry;
		lhcell **apNew;
		sxu32 n;
		
		apNew = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nNewSize * sizeof(lhcell *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhcell *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPage->pList;
			for(;;){
				/* Loop one */
				if( n >= pPage->nCell ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pPage->pHash->sAllocator,(void *)pPage->apCell);
			pPage->apCell = apNew;
			pPage->nCellSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}